

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

bool skip_space(iit *iter,iit *ender)

{
  bool bVar1;
  int iVar2;
  reference pcVar3;
  iit *ender_local;
  iit *iter_local;
  
  while (bVar1 = __gnu_cxx::operator!=(iter,ender), bVar1) {
    pcVar3 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(iter);
    iVar2 = isspace((int)*pcVar3);
    if (iVar2 == 0) break;
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(iter);
  }
  bVar1 = __gnu_cxx::operator==(iter,ender);
  iter_local._7_1_ = !bVar1;
  return iter_local._7_1_;
}

Assistant:

bool skip_space(iit &iter, iit &ender) {
    while (iter != ender) {
        if (! std::isspace(*iter)) break;
        ++iter;
    }
    if (iter == ender) return false;
    
    return true;
}